

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O0

void fidentity8x16_new_avx2(__m128i *input,__m128i *output,int8_t cos_bit)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  __m256i a;
  __m256i a_00;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined8 *puVar8;
  long in_RSI;
  long in_RDI;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined8 uVar11;
  longlong lVar12;
  undefined1 auVar13 [16];
  __m256i b_hi;
  __m256i b_lo;
  __m256i a_hi;
  __m256i a_lo;
  int i;
  __m256i temp;
  __m256i one;
  undefined8 in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdb8;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  int local_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  
  auVar13 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar13 = vpinsrw_avx(auVar13,1,2);
  auVar13 = vpinsrw_avx(auVar13,1,3);
  auVar13 = vpinsrw_avx(auVar13,1,4);
  auVar13 = vpinsrw_avx(auVar13,1,5);
  auVar13 = vpinsrw_avx(auVar13,1,6);
  auVar13 = vpinsrw_avx(auVar13,1,7);
  auVar10 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar10 = vpinsrw_avx(auVar10,1,2);
  auVar10 = vpinsrw_avx(auVar10,1,3);
  auVar10 = vpinsrw_avx(auVar10,1,4);
  auVar10 = vpinsrw_avx(auVar10,1,5);
  auVar10 = vpinsrw_avx(auVar10,1,6);
  auVar10 = vpinsrw_avx(auVar10,1,7);
  auVar10 = ZEXT116(0) * auVar13 + ZEXT116(1) * auVar10;
  auVar13 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar13;
  for (local_1e4 = 0; uStack_1a8 = auVar13._8_8_, uStack_1b0 = auVar13._0_8_, local_1e4 < 0x10;
      local_1e4 = local_1e4 + 2) {
    auVar7 = *(undefined1 (*) [16])(in_RDI + (long)local_1e4 * 0x10);
    puVar8 = (undefined8 *)((long)local_1e4 * 0x10 + 0x10 + in_RDI);
    uVar9 = *puVar8;
    uVar11 = puVar8[1];
    auVar2._16_8_ = uVar9;
    auVar2._0_16_ = auVar7;
    auVar2._24_8_ = uVar11;
    auVar1._16_8_ = uStack_1b0;
    auVar1._0_16_ = auVar10;
    auVar1._24_8_ = uStack_1a8;
    auVar2 = vpunpcklwd_avx2(auVar2,auVar1);
    auVar4._16_8_ = uVar9;
    auVar4._0_16_ = auVar7;
    auVar4._24_8_ = uVar11;
    auVar3._16_8_ = uStack_1b0;
    auVar3._0_16_ = auVar10;
    auVar3._24_8_ = uStack_1a8;
    auVar1 = vpunpckhwd_avx2(auVar4,auVar3);
    uVar9 = auVar1._0_8_;
    uVar11 = auVar1._8_8_;
    lVar12 = auVar1._16_8_;
    uStack_228 = auVar1._24_8_;
    local_220 = auVar2._0_8_;
    uStack_218 = auVar2._8_8_;
    uStack_210 = auVar2._16_8_;
    uStack_208 = auVar2._24_8_;
    a[1] = uVar9;
    a[0] = in_stack_fffffffffffffdb8;
    a[2] = uVar11;
    a[3] = lVar12;
    scale_round_avx2(a,(int)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
    a_00[1] = uVar9;
    a_00[0] = uStack_208;
    a_00[2] = uVar11;
    a_00[3] = lVar12;
    scale_round_avx2(a_00,(int)((ulong)uStack_210 >> 0x20));
    auVar6._8_8_ = uStack_218;
    auVar6._0_8_ = local_220;
    auVar6._16_8_ = uStack_210;
    auVar6._24_8_ = uStack_208;
    auVar5._8_8_ = uVar11;
    auVar5._0_8_ = uVar9;
    auVar5._16_8_ = lVar12;
    auVar5._24_8_ = uStack_228;
    auVar1 = vpackssdw_avx2(auVar6,auVar5);
    local_1e0 = auVar1._0_8_;
    uStack_1d8 = auVar1._8_8_;
    uStack_1d0 = auVar1._16_8_;
    uStack_1c8 = auVar1._24_8_;
    puVar8 = (undefined8 *)(in_RSI + (long)local_1e4 * 0x10);
    *puVar8 = local_1e0;
    puVar8[1] = uStack_1d8;
    puVar8 = (undefined8 *)(in_RSI + (long)(local_1e4 + 1) * 0x10);
    *puVar8 = uStack_1d0;
    puVar8[1] = uStack_1c8;
    in_stack_fffffffffffffdb0 = uStack_210;
    in_stack_fffffffffffffdb8 = uStack_208;
  }
  return;
}

Assistant:

static inline void fidentity8x16_new_avx2(const __m128i *input, __m128i *output,
                                          int8_t cos_bit) {
  (void)cos_bit;
  const __m256i one = _mm256_set1_epi16(1);
  __m256i temp;
  for (int i = 0; i < 16; i += 2) {
    temp = _mm256_insertf128_si256(_mm256_castsi128_si256(input[i]),
                                   input[i + 1], 0x1);
    const __m256i a_lo = _mm256_unpacklo_epi16(temp, one);
    const __m256i a_hi = _mm256_unpackhi_epi16(temp, one);
    const __m256i b_lo = scale_round_avx2(a_lo, 2 * NewSqrt2);
    const __m256i b_hi = scale_round_avx2(a_hi, 2 * NewSqrt2);
    temp = _mm256_packs_epi32(b_lo, b_hi);
    output[i] = _mm256_castsi256_si128(temp);
    output[i + 1] = _mm256_extractf128_si256(temp, 0x1);
  }
}